

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::
CmpHelperOpFailure<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,char[4]>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,char *op,
          iu_basic_string_view<char,_std::char_traits<char>_> *val1,char (*val2) [4])

{
  AssertionResult *pAVar1;
  iu_basic_string_view<char,_std::char_traits<char>_> *v;
  char *local_a0;
  char *local_98;
  internal *local_90;
  string local_88;
  string local_68;
  AssertionResult local_48;
  
  local_48.m_message._M_dataplus._M_p = (pointer)&local_48.m_message.field_2;
  local_48.m_message._M_string_length = 0;
  local_48.m_message.field_2._M_local_buf[0] = '\0';
  local_48.m_result = false;
  local_a0 = expr2;
  local_98 = expr1;
  local_90 = this;
  pAVar1 = AssertionResult::operator<<(&local_48,(char (*) [18])"error: Expected: ");
  pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&local_90);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x129356);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_a0);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x129356);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_98);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"\n  Actual: ");
  PrintToString<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>>
            (&local_68,(iutest *)op,v);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_68);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  PrintToString<char[4]>(&local_88,(char (*) [4])val1);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_88);
  AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2, const char* op
    , const T1& val1, const T2& val2)
{
    return AssertionFailure() << "error: Expected: " << expr1 << " " << op << " " << expr2
        << "\n  Actual: " << FormatForComparisonFailureMessage(val1, val2)
        << " vs " << FormatForComparisonFailureMessage(val2, val1);
}